

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O3

string_view __thiscall slang::SourceManager::getRawFileName(SourceManager *this,BufferID buffer)

{
  pointer pvVar1;
  undefined8 *puVar2;
  ulong uVar3;
  char *pcVar4;
  size_t sVar5;
  string_view sVar6;
  
  std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)this);
  pcVar4 = "";
  if (buffer.id != 0) {
    uVar3 = (ulong)buffer.id;
    pvVar1 = (this->bufferEntries).
             super__Vector_base<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>,_std::allocator<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (((uVar3 < (ulong)((long)(this->bufferEntries).
                                super__Vector_base<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>,_std::allocator<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1 >> 6)) &&
        (*(__index_type *)
          ((long)&pvVar1[uVar3].
                  super__Variant_base<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
                  .
                  super__Move_assign_alias<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
                  .
                  super__Copy_assign_alias<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
          + 0x38) == '\0')) &&
       (puVar2 = *(undefined8 **)
                  &pvVar1[uVar3].
                   super__Variant_base<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
                   .
                   super__Move_assign_alias<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
                   .
                   super__Copy_assign_alias<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
       , puVar2 != (undefined8 *)0x0)) {
      pcVar4 = (char *)*puVar2;
      sVar5 = puVar2[1];
      goto LAB_0070d8f0;
    }
  }
  sVar5 = 0;
LAB_0070d8f0:
  pthread_rwlock_unlock((pthread_rwlock_t *)this);
  sVar6._M_str = pcVar4;
  sVar6._M_len = sVar5;
  return sVar6;
}

Assistant:

std::string_view SourceManager::getRawFileName(BufferID buffer) const {
    std::shared_lock<std::shared_mutex> lock(mutex);
    auto info = getFileInfo(buffer, lock);
    if (!info || !info->data)
        return "";

    return info->data->name;
}